

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daily_file_sink.h
# Opt level: O2

void __thiscall
spdlog::sinks::daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator>::sink_it_
          (daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator> *this,log_msg *msg)

{
  time_point tp;
  long lVar1;
  formatter *pfVar2;
  time_point tVar3;
  undefined **__n;
  void *__buf;
  filename_t filename;
  memory_buf_t formatted;
  filename_t local_170;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> local_150;
  
  tp.__d.__r = (duration)(msg->time).__d.__r;
  lVar1 = (this->rotation_tp_).__d.__r;
  if (lVar1 <= (long)tp.__d.__r) {
    now_tm((tm *)&local_150,this,tp);
    daily_filename_calculator::calc_filename(&local_170,&this->base_filename_,(tm *)&local_150);
    details::file_helper::open(&this->file_helper_,(char *)&local_170,(uint)this->truncate_);
    tVar3 = next_rotation_tp_(this);
    (this->rotation_tp_).__d.__r = (rep)tVar3.__d.__r;
    std::__cxx11::string::~string((string *)&local_170);
  }
  local_150.super_buffer<char>.ptr_ = local_150.store_;
  local_150.super_buffer<char>.size_ = 0;
  __n = &PTR_grow_0015c480;
  local_150.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0015c480;
  local_150.super_buffer<char>.capacity_ = 0xfa;
  pfVar2 = (this->super_base_sink<std::mutex>).formatter_._M_t.
           super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
           super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
           super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
  (*pfVar2->_vptr_formatter[2])(pfVar2,msg,&local_150);
  details::file_helper::write(&this->file_helper_,(int)&local_150,__buf,(size_t)__n);
  if ((lVar1 <= (long)tp.__d.__r) && (this->max_files_ != 0)) {
    delete_old_(this);
  }
  ::fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
            (&local_150);
  return;
}

Assistant:

void sink_it_(const details::log_msg &msg) override
    {
        auto time = msg.time;
        bool should_rotate = time >= rotation_tp_;
        if (should_rotate)
        {
            auto filename = FileNameCalc::calc_filename(base_filename_, now_tm(time));
            file_helper_.open(filename, truncate_);
            rotation_tp_ = next_rotation_tp_();
        }
        memory_buf_t formatted;
        base_sink<Mutex>::formatter_->format(msg, formatted);
        file_helper_.write(formatted);

        // Do the cleaning only at the end because it might throw on failure.
        if (should_rotate && max_files_ > 0)
        {
            delete_old_();
        }
    }